

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNextAgentIndex::operator()
          (SetNextAgentIndex *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  ostream *poVar2;
  
  pPVar1 = this->_m_po;
  if ((ulong)pPVar1->_m_curAI < pPVar1->_m_nrA) {
    pPVar1->_m_curAI = pPVar1->_m_curAI + 1;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"SetNextAgentIndex - ERROR: current agent index (")
  ;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,") out of bounds (number of agents=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_curAI < _m_po->_m_nrA)
                    _m_po->_m_curAI++;
                else
                    std::cout << "SetNextAgentIndex - ERROR: current agent index ("<<
                               _m_po->_m_curAI<<") out of bounds (number of agents="<<
                        _m_po->_m_nrA<<")"<<std::endl;            
            }